

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::useMagnetometerMeasurements
          (AttitudeQuaternionEKF *this,bool use_magnetometer_measurements)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  Span<double,__1L> *this_00;
  byte in_SIL;
  long *in_RDI;
  Span<double,__1L> x_span;
  bool ok;
  double gyro_bias_var;
  double ang_vel_var;
  double orientation_var;
  Span<double,__1L> P_span;
  MatrixDynSize P;
  double in_stack_000000d8;
  double in_stack_000000e0;
  double in_stack_000000e8;
  VectorDynSize x;
  undefined4 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffedd;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  Span<double,__1L> *in_stack_fffffffffffffee0;
  Span<double,__1L> *in_stack_ffffffffffffff00;
  DiscreteExtendedKalmanFilterHelper *in_stack_ffffffffffffff08;
  undefined1 local_b8 [23];
  byte local_a1;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_84;
  MatrixDynSize local_60 [40];
  VectorDynSize local_38 [39];
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  if (local_11 == (*(byte *)(in_RDI + 0x5b) & 1)) {
    local_1 = 1;
  }
  else {
    iDynTree::VectorDynSize::VectorDynSize(local_38,(VectorDynSize *)(in_RDI + 0x6f));
    uVar3 = iDynTree::VectorDynSize::size();
    uVar4 = iDynTree::VectorDynSize::size();
    iDynTree::MatrixDynSize::MatrixDynSize(local_60,uVar3,uVar4);
    iDynTree::MatrixDynSize::data();
    iDynTree::MatrixDynSize::capacity();
    Span<double,_-1L>::Span
              (in_stack_fffffffffffffee0,
               (pointer)CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,
                                          CONCAT15(in_stack_fffffffffffffedd,
                                                   CONCAT14(in_stack_fffffffffffffedc,
                                                            in_stack_fffffffffffffed8)))),0x625340);
    bVar1 = DiscreteExtendedKalmanFilterHelper::ekfGetStateCovariance
                      (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (bVar1) {
      puVar5 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_60,0);
      local_90 = *puVar5;
      puVar5 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_60,4);
      local_98 = *puVar5;
      puVar5 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_60,7);
      local_a0 = *puVar5;
      *(byte *)(in_RDI + 0x5b) = local_11 & 1;
      DiscreteExtendedKalmanFilterHelper::ekfReset
                ((DiscreteExtendedKalmanFilterHelper *)(in_RDI + 1));
      local_a1 = initializeFilter((AttitudeQuaternionEKF *)
                                  CONCAT17(in_stack_fffffffffffffedf,
                                           CONCAT16(in_stack_fffffffffffffede,
                                                    CONCAT15(in_stack_fffffffffffffedd,
                                                             CONCAT14(in_stack_fffffffffffffedc,
                                                                      in_stack_fffffffffffffed8)))))
      ;
      iDynTree::VectorDynSize::data();
      this_00 = (Span<double,__1L> *)iDynTree::VectorDynSize::size();
      Span<double,_-1L>::Span
                (this_00,(pointer)CONCAT17(in_stack_fffffffffffffedf,
                                           CONCAT16(in_stack_fffffffffffffede,
                                                    CONCAT15(in_stack_fffffffffffffedd,
                                                             CONCAT14(in_stack_fffffffffffffedc,
                                                                      in_stack_fffffffffffffed8)))),
                 0x6254c0);
      bVar2 = (**(code **)(*in_RDI + 0x58))(in_RDI,local_b8);
      if ((bVar2 & 1) == 0) {
        local_a1 = 0;
      }
      local_a1 = local_a1 & 1;
      bVar1 = setInitialStateCovariance(_x,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
      if (!bVar1) {
        local_a1 = 0;
      }
      local_a1 = local_a1 & 1;
      local_1 = local_a1;
    }
    else {
      local_1 = 0;
    }
    local_84 = 1;
    iDynTree::MatrixDynSize::~MatrixDynSize(local_60);
    iDynTree::VectorDynSize::~VectorDynSize(local_38);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::useMagnetometerMeasurements(bool use_magnetometer_measurements)
{
    if (use_magnetometer_measurements == m_params_qekf.use_magnetometer_measurements)
    {
        return true;
    }

    // store current state estimate and variance
    iDynTree::VectorDynSize x(m_x);
    iDynTree::MatrixDynSize P(m_x.size(), m_x.size());
    iDynTree::Span<double> P_span(P.data(), P.capacity());
    if (!ekfGetStateCovariance(P_span))
    {
        return false;
    }

    // get variances
    double orientation_var{P(0,0)};
    double ang_vel_var{P(4,4)};
    double gyro_bias_var{P(7,7)};

    m_params_qekf.use_magnetometer_measurements = use_magnetometer_measurements;
    ekfReset();

    bool ok = initializeFilter();
    iDynTree::Span<double> x_span(x.data(), x.size());
    ok = setInternalState(x_span) && ok;
    ok = setInitialStateCovariance(orientation_var, ang_vel_var, gyro_bias_var) && ok;
    return ok;
}